

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.h
# Opt level: O3

void __thiscall
Liby::WeakTimerHolder::WeakTimerHolder(WeakTimerHolder *this,shared_ptr<Liby::Timer> *timer)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __suseconds_t _Var3;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  peVar1 = (timer->super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28 = (code *)0x0;
  uStack_20 = 0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  (this->timer_).id_ = peVar1->id_;
  _Var3 = (peVar1->timeout_).tv_.tv_usec;
  (this->timer_).timeout_.tv_.tv_sec = (peVar1->timeout_).tv_.tv_sec;
  (this->timer_).timeout_.tv_.tv_usec = _Var3;
  std::function<void_()>::function(&(this->timer_).handler_,(function<void_()> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  (this->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (timer->super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (timer->super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->weakTimerPtr_).super___weak_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
    }
  }
  return;
}

Assistant:

WeakTimerHolder(const std::shared_ptr<Timer> &timer)
        : timer_(timer->id(), timer->timeout(), nullptr), weakTimerPtr_(timer) {
    }